

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitTable(PrintSExpression *this,Table *curr)

{
  bool bVar1;
  ostream *poVar2;
  Table *curr_local;
  PrintSExpression *this_local;
  
  bVar1 = Importable::imported(&curr->super_Importable);
  if (bVar1) {
    doIndent(this->o,this->indent);
    std::operator<<(this->o,'(');
    emitImportHeader(this,&curr->super_Importable);
    printTableHeader(this,curr);
    poVar2 = std::operator<<(this->o,')');
    std::operator<<(poVar2,this->maybeNewLine);
  }
  else {
    doIndent(this->o,this->indent);
    printTableHeader(this,curr);
    std::operator<<(this->o,this->maybeNewLine);
  }
  return;
}

Assistant:

void PrintSExpression::visitTable(Table* curr) {
  if (curr->imported()) {
    doIndent(o, indent);
    o << '(';
    emitImportHeader(curr);
    printTableHeader(curr);
    o << ')' << maybeNewLine;
  } else {
    doIndent(o, indent);
    printTableHeader(curr);
    o << maybeNewLine;
  }
}